

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cc
# Opt level: O0

int __thiscall cnn::LSTMBuilder::copy(LSTMBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Parameters *this_00;
  size_type sVar1;
  size_type sVar2;
  reference pvVar3;
  reference ppPVar4;
  const_reference this_01;
  const_reference ppPVar5;
  EVP_PKEY_CTX *src_00;
  size_t j;
  size_t i;
  LSTMBuilder *rnn_lstm;
  ulong local_28;
  ulong local_20;
  
  sVar1 = std::
          vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
          ::size(&this->params);
  sVar2 = std::
          vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
          ::size((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                  *)(dst + 0x28));
  if (sVar1 == sVar2) {
    local_20 = 0;
    while( true ) {
      sVar1 = std::
              vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
              ::size(&this->params);
      if (sVar1 <= local_20) break;
      local_28 = 0;
      while( true ) {
        pvVar3 = std::
                 vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                 ::operator[](&this->params,local_20);
        sVar1 = std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::size(pvVar3);
        if (sVar1 <= local_28) break;
        pvVar3 = std::
                 vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                 ::operator[](&this->params,local_20);
        ppPVar4 = std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[]
                            (pvVar3,local_28);
        this_00 = *ppPVar4;
        this_01 = std::
                  vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                  ::operator[]((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                                *)(dst + 0x28),local_20);
        ppPVar5 = std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[]
                            (this_01,local_28);
        Parameters::copy(this_00,(EVP_PKEY_CTX *)*ppPVar5,src_00);
        local_28 = local_28 + 1;
      }
      local_20 = local_20 + 1;
    }
    return (int)local_20;
  }
  __assert_fail("params.size() == rnn_lstm.params.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/lstm.cc"
                ,0x9b,"virtual void cnn::LSTMBuilder::copy(const RNNBuilder &)");
}

Assistant:

void LSTMBuilder::copy(const RNNBuilder & rnn) {
  const LSTMBuilder & rnn_lstm = (const LSTMBuilder&)rnn;
  assert(params.size() == rnn_lstm.params.size());
  for(size_t i = 0; i < params.size(); ++i)
      for(size_t j = 0; j < params[i].size(); ++j)
        params[i][j]->copy(*rnn_lstm.params[i][j]);
}